

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_array_container_lazy_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  undefined4 *puVar1;
  int iVar2;
  array_container_t *paVar3;
  size_t sVar4;
  bitset_container_t *pbVar5;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  container_t **dst_local;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  iVar2 = src_1->cardinality + src_2->cardinality;
  *dst = (container_t *)0x0;
  if (iVar2 < 0x401) {
    if (src_1->capacity < iVar2) {
      paVar3 = array_container_create_given_capacity(iVar2 * 2);
      *dst = paVar3;
      if (*dst == (container_t *)0x0) {
        src_1_local._7_1_ = true;
      }
      else {
        array_container_union(src_1,src_2,(array_container_t *)*dst);
        src_1_local._7_1_ = false;
      }
    }
    else {
      memmove(src_1->array + src_2->cardinality,src_1->array,(long)src_1->cardinality << 1);
      sVar4 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar4;
      src_1_local._7_1_ = false;
    }
  }
  else {
    pbVar5 = bitset_container_create();
    *dst = pbVar5;
    if (*dst != (container_t *)0x0) {
      puVar1 = (undefined4 *)*dst;
      bitset_set_list(*(uint64_t **)(puVar1 + 2),src_1->array,(long)src_1->cardinality);
      bitset_set_list(*(uint64_t **)(puVar1 + 2),src_2->array,(long)src_2->cardinality);
      *puVar1 = 0xffffffff;
    }
    src_1_local._7_1_ = true;
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_array_container_lazy_inplace_union(
    array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        if(src_1->capacity < totalCardinality) {
          *dst = array_container_create_given_capacity(2  * totalCardinality); // be purposefully generous
          if (*dst != NULL) {
              array_container_union(src_1, src_2, CAST_array(*dst));
          } else {
            return true; // otherwise failure won't be caught
          }
          return false;  // not a bitset
        } else {
          memmove(src_1->array + src_2->cardinality, src_1->array, src_1->cardinality * sizeof(uint16_t));
          src_1->cardinality = (int32_t)union_uint16(src_1->array + src_2->cardinality, src_1->cardinality,
                                  src_2->array, src_2->cardinality, src_1->array);
          return false; // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}